

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

Position * __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Position::operator+=(Position *this,size_t t_distance)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  iVar3 = this->line;
  iVar4 = this->col;
  pcVar2 = this->m_pos;
  iVar1 = this->m_last_col;
  if (t_distance != 0) {
    do {
      if (pcVar2 != this->m_end) {
        bVar5 = *pcVar2 == '\n';
        if (bVar5) {
          iVar1 = iVar4;
        }
        iVar4 = iVar4 + 1;
        if (bVar5) {
          iVar4 = 1;
        }
        iVar3 = iVar3 + (uint)bVar5;
        pcVar2 = pcVar2 + 1;
      }
      t_distance = t_distance - 1;
    } while (t_distance != 0);
  }
  this->line = iVar3;
  this->col = iVar4;
  this->m_pos = pcVar2;
  this->m_last_col = iVar1;
  return this;
}

Assistant:

constexpr Position &operator+=(size_t t_distance) noexcept {
          *this = (*this) + t_distance;
          return *this;
        }